

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lefreader.cpp
# Opt level: O2

bool __thiscall LEFReader::parseVia(LEFReader *this)

{
  string *tokstr;
  bool bVar1;
  __type_conflict _Var2;
  token_t tVar3;
  string viaName;
  allocator<char> local_69;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  tokstr = &this->m_tokstr;
  tVar3 = tokenize(this,tokstr);
  this->m_curtok = tVar3;
  local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
  local_48._M_string_length = 0;
  local_48.field_2._M_local_buf[0] = '\0';
  if (tVar3 == TOK_IDENT) {
    std::__cxx11::string::_M_assign((string *)&local_48);
    do {
      tVar3 = tokenize(this,tokstr);
      while( true ) {
        this->m_curtok = tVar3;
        bVar1 = std::operator!=(tokstr,"END");
        if (!bVar1) break;
        tVar3 = tokenize(this,tokstr);
      }
      tVar3 = tokenize(this,tokstr);
      this->m_curtok = tVar3;
      if (tVar3 != TOK_IDENT) {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_68,"Expected via name after END\n",&local_69);
        error(this,&local_68);
        goto LAB_001258d8;
      }
      _Var2 = std::operator==(tokstr,&local_48);
    } while (_Var2);
    tVar3 = tokenize(this,tokstr);
    this->m_curtok = tVar3;
    bVar1 = true;
    if (tVar3 == TOK_EOL) goto LAB_001258e4;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"Expected EOL after END <vianame>\n",&local_69);
    error(this,&local_68);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_68,"Expected identifier in via name\n",&local_69);
    error(this,&local_68);
  }
LAB_001258d8:
  std::__cxx11::string::~string((string *)&local_68);
  bVar1 = false;
LAB_001258e4:
  std::__cxx11::string::~string((string *)&local_48);
  return bVar1;
}

Assistant:

bool LEFReader::parseVia()
{
    // VIA <vianame> ...
    // keep on reading tokens until we
    // find END <vianame>

    m_curtok = tokenize(m_tokstr);
    std::string viaName;

    if (m_curtok != TOK_IDENT)
    {
        error("Expected identifier in via name\n");
        return false;
    }

    viaName = m_tokstr;

    // read until we get END <vianame>
    do
    {
        m_curtok = tokenize(m_tokstr);
        while(m_tokstr != "END")
        {
            m_curtok = tokenize(m_tokstr);
        }

        // read via name
        m_curtok = tokenize(m_tokstr);
        if (m_curtok != TOK_IDENT)
        {
            error("Expected via name after END\n");
            return false;
        }
    } while(m_tokstr == viaName);
    
    m_curtok = tokenize(m_tokstr);
    if (m_curtok != TOK_EOL)
    {
        error("Expected EOL after END <vianame>\n");
        return false;
    }

    return true;
}